

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O3

void __thiscall psy::C::TypeCheckerTester::case0222(TypeCheckerTester *this)

{
  Expectation *pEVar1;
  string local_1c8;
  string local_1a8;
  Expectation local_188;
  Expectation local_d0;
  
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"\nvoid _ ()\n{\n    long x ;\n    int * y ;\n    x * y ;\n}\n",""
            );
  Expectation::Expectation(&local_188);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,
             TypeChecker::DiagnosticsReporter::ID_of_ExpectedExpressionOfArithmeticType_abi_cxx11_.
             _M_dataplus._M_p,
             TypeChecker::DiagnosticsReporter::ID_of_ExpectedExpressionOfArithmeticType_abi_cxx11_.
             _M_dataplus._M_p +
             TypeChecker::DiagnosticsReporter::ID_of_ExpectedExpressionOfArithmeticType_abi_cxx11_.
             _M_string_length);
  pEVar1 = Expectation::diagnostic(&local_188,Error,&local_1c8);
  Expectation::Expectation(&local_d0,pEVar1);
  checkTypes(this,&local_1a8,&local_d0);
  if (local_d0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_d0.declarations_);
  if (local_d0.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.ambiguityText_._M_dataplus._M_p != &local_d0.ambiguityText_.field_2) {
    operator_delete(local_d0.ambiguityText_._M_dataplus._M_p,
                    local_d0.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0.descriptorsE_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_188.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_188.declarations_);
  if (local_188.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.ambiguityText_._M_dataplus._M_p != &local_188.ambiguityText_.field_2) {
    operator_delete(local_188.ambiguityText_._M_dataplus._M_p,
                    local_188.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188.descriptorsE_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TypeCheckerTester::case0222()
{
    auto s = R"(
void _ ()
{
    long x ;
    int * y ;
    x * y ;
}
)";

    checkTypes(s,
               Expectation()
                  .diagnostic(Expectation::ErrorOrWarn::Error,
                              TypeChecker::DiagnosticsReporter::ID_of_ExpectedExpressionOfArithmeticType));
}